

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O2

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeSdtaListChunk(SoundFontWriter *this)

{
  pointer this_00;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  local_30;
  
  std::make_unique<sf2cute::RIFFListChunk,char_const(&)[5]>
            ((char (*) [5])
             &local_30.
              super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = local_30.
            super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  make_unique<sf2cute::SFRIFFSmplChunk,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>const&>
            (&local_30);
  local_30.
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_30.
       super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)this_00,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_30.
                 super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
  if (local_30.
      super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)((((local_30.
                  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_).
              _M_string_length)();
  }
  local_30.
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_30.
      super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((((local_30.
                  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_).
              _M_string_length)();
  }
  this->file_ = (SoundFont *)
                local_30.
                super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeSdtaListChunk() {
  std::unique_ptr<RIFFListChunk> sdta = std::make_unique<RIFFListChunk>("sdta");
  sdta->AddSubchunk(std::make_unique<SFRIFFSmplChunk>(file().samples()));
  return std::move(sdta);
}